

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelUri.cpp
# Opt level: O0

void __thiscall
aeron::archive::ChannelUri::ChannelUri(ChannelUri *this,string *media,ParamsMap *params)

{
  allocator local_41;
  string local_40;
  ParamsMap *local_20;
  ParamsMap *params_local;
  string *media_local;
  ChannelUri *this_local;
  
  local_20 = params;
  params_local = (ParamsMap *)media;
  media_local = &this->prefix_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"",&local_41);
  ChannelUri(this,&local_40,(string *)params_local,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

ChannelUri::ChannelUri(const std::string& media, ParamsMap&& params)
    : ChannelUri("", media, std::move(params)) {}